

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmMemberAccess(LlvmCompilationContext *ctx,ExprMemberAccess *node)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  LLVMValueRef pLVar3;
  uint uVar4;
  
  CompileLlvm(ctx,node->value);
  pp_Var1 = node->value->type[1]._vptr_TypeBase;
  p_Var2 = pp_Var1[0xd];
  if (p_Var2 != (_func_int *)0x0) {
    uVar4 = (uint)(*(int *)(pp_Var1 + 1) == 0x14);
    do {
      uVar4 = uVar4 + 1;
      if (*(VariableData **)(p_Var2 + 8) == node->member->variable) {
        if (uVar4 != 0) {
          pLVar3 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
          return pLVar3;
        }
        break;
      }
      p_Var2 = *(_func_int **)(p_Var2 + 0x18);
    } while (p_Var2 != (_func_int *)0x0);
  }
  __assert_fail("memberIndex != ~0u",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x589,
                "LLVMValueRef CompileLlvmMemberAccess(LlvmCompilationContext &, ExprMemberAccess *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmMemberAccess(LlvmCompilationContext &ctx, ExprMemberAccess *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	TypeRef *typeRef = getType<TypeRef>(node->value->type);
	TypeStruct *typeStruct = getType<TypeStruct>(typeRef->subType);

	unsigned memberIndex = ~0u;

	unsigned currMember = 0;

	// Unsized array types have a hidden member (pointer) at index 0
	if(isType<TypeUnsizedArray>(typeStruct))
		currMember++;

	for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
	{
		if(curr->variable == node->member->variable)
		{
			memberIndex = currMember;
			break;
		}

		currMember++;
	}

	assert(memberIndex != ~0u);

	LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), LLVMConstInt(LLVMInt32TypeInContext(ctx.context), memberIndex, true) };

	return CheckType(ctx, node, LLVMBuildGEP(ctx.builder, value, indices, 2, ""));
}